

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::Reflection::MutableRepeatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  bool bVar1;
  uint32_t uVar2;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *this_01;
  MessageLite *pMVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *pVVar4;
  char *description;
  Descriptor *pDVar5;
  Metadata MVar6;
  
  MVar6 = Message::GetMetadata(message);
  if (MVar6.reflection != this) {
    pDVar5 = this->descriptor_;
    MVar6 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar5,MVar6.descriptor,field,"MutableRepeatedMessage");
  }
  pDVar5 = this->descriptor_;
  if (field->containing_type_ == pDVar5) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"MutableRepeatedMessage",CPPTYPE_MESSAGE);
      }
      if ((field->field_0x1 & 8) == 0) {
        bVar1 = FieldDescriptor::is_map(field);
        if (bVar1) {
          this_00 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
          this_01 = internal::MapFieldBase::MutableRepeatedField(this_00);
        }
        else {
          this_01 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field)
          ;
        }
        pVVar4 = internal::RepeatedPtrFieldBase::
                 Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                           (this_01,index);
        return pVVar4;
      }
      uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
      pMVar3 = internal::ExtensionSet::MutableRepeatedMessage
                         ((ExtensionSet *)
                          ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                          field->number_,index);
      return (Message *)pMVar3;
    }
    pDVar5 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar5,field,"MutableRepeatedMessage",description);
}

Assistant:

Message* Reflection::MutableRepeatedMessage(Message* message,
                                            const FieldDescriptor* field,
                                            int index) const {
  USAGE_MUTABLE_CHECK_ALL(MutableRepeatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableRepeatedMessage(field->number(),
                                                             index));
  } else {
    if (IsMapFieldInApi(field)) {
      return MutableRaw<MapFieldBase>(message, field)
          ->MutableRepeatedField()
          ->Mutable<GenericTypeHandler<Message> >(index);
    } else {
      return MutableRaw<RepeatedPtrFieldBase>(message, field)
          ->Mutable<GenericTypeHandler<Message> >(index);
    }
  }
}